

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O0

void __thiscall PatchAddGolasHeart::alter_world(PatchAddGolasHeart *this,World *w)

{
  MapPalette *pMVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  Map *pMVar4;
  MapPalette *pMVar5;
  vector<MapConnection,_std::allocator<MapConnection>_> *pvVar6;
  MapConnection local_dc;
  MapConnection local_d0;
  MapConnection local_c4;
  MapConnection local_b8;
  MapConnection local_ac;
  MapConnection local_a0;
  MapConnection local_94;
  MapConnection local_88;
  MapConnection local_7c;
  MapConnection local_70;
  MapConnection local_64;
  MapConnection local_58;
  MapConnection local_4c;
  MapPalette *local_40;
  MapPalette *final_fight_palette;
  MapPalette *stairs_palette_1;
  MapPalette *stairs_palette_2;
  MapPalette *golas_heart_palette;
  RandomizerWorld *world;
  World *w_local;
  PatchAddGolasHeart *this_local;
  
  golas_heart_palette = (MapPalette *)w;
  world = (RandomizerWorld *)w;
  w_local = (World *)this;
  stairs_palette_2 = build_golas_heart_palette(w);
  pMVar1 = golas_heart_palette;
  pMVar4 = World::map((World *)golas_heart_palette,0x156);
  pMVar5 = Map::palette(pMVar4);
  stairs_palette_1 = build_greyscale_palette((World *)pMVar1,pMVar5,1.0);
  final_fight_palette =
       build_transition_palette((World *)golas_heart_palette,stairs_palette_2,stairs_palette_1);
  pMVar1 = golas_heart_palette;
  pMVar4 = World::map((World *)golas_heart_palette,0x6f);
  pMVar5 = Map::palette(pMVar4);
  local_40 = build_greyscale_palette((World *)pMVar1,pMVar5,0.4);
  pMVar4 = add_gh_room_1((RandomizerWorld *)golas_heart_palette);
  this->_room_1 = pMVar4;
  pMVar4 = add_gh_room_2((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_2 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_1);
  uVar3 = Map::id(this->_room_2);
  MapConnection::MapConnection(&local_4c,uVar2,'!','0',uVar3,'\x19','\"','\x02','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_4c);
  pMVar4 = add_gh_room_3((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_3 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_2);
  uVar3 = Map::id(this->_room_3);
  MapConnection::MapConnection(&local_58,uVar2,'\x19','\x17',uVar3,'\x19','\"','\x02','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_58);
  pMVar4 = add_gh_room_4((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_4 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_3);
  uVar3 = Map::id(this->_room_4);
  MapConnection::MapConnection(&local_64,uVar2,'\x19','\x13',uVar3,'\x19','\"','\x02','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_64);
  pMVar4 = add_gh_room_5((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_5 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_5);
  uVar3 = Map::id(this->_room_4);
  MapConnection::MapConnection(&local_70,uVar2,'\x13','\x19',uVar3,'\"','\x19','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_70);
  pMVar4 = add_gh_room_6((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_6 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_6);
  uVar3 = Map::id(this->_room_5);
  MapConnection::MapConnection(&local_7c,uVar2,'\x19','\x13',uVar3,'\x19','\"','\x02','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_7c);
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_6);
  uVar3 = Map::id(this->_room_2);
  MapConnection::MapConnection(&local_88,uVar2,'\x13','\x19',uVar3,'\"','\x19','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_88);
  pMVar4 = add_gh_room_7((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_7 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_7);
  uVar3 = Map::id(this->_room_6);
  MapConnection::MapConnection(&local_94,uVar2,'\x13','\x19',uVar3,'\"','\x19','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_94);
  pMVar4 = add_gh_room_8((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_8 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_2);
  uVar3 = Map::id(this->_room_8);
  MapConnection::MapConnection(&local_a0,uVar2,'\x13','\x19',uVar3,'\x1b','\x12','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_a0);
  pMVar4 = add_gh_room_9((RandomizerWorld *)golas_heart_palette,stairs_palette_2);
  this->_room_9 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_9);
  uVar3 = Map::id(this->_room_8);
  MapConnection::MapConnection(&local_ac,uVar2,'\x1f','\x12',uVar3,'\x12','\x13','\n','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_ac);
  pMVar4 = add_gh_stairs_room((RandomizerWorld *)golas_heart_palette,stairs_palette_2,0x331);
  this->_room_10 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_9);
  uVar3 = Map::id(this->_room_10);
  MapConnection::MapConnection(&local_b8,uVar2,'\x10','3',uVar3,'-','\x16','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_b8);
  pMVar4 = add_gh_stairs_room((RandomizerWorld *)golas_heart_palette,final_fight_palette,0x332);
  this->_room_11 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_10);
  uVar3 = Map::id(this->_room_11);
  MapConnection::MapConnection(&local_c4,uVar2,'\x14','\x16',uVar3,'-','\x16','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_c4);
  pMVar4 = add_gh_stairs_room((RandomizerWorld *)golas_heart_palette,stairs_palette_1,0x333);
  this->_room_12 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_11);
  uVar3 = Map::id(this->_room_12);
  MapConnection::MapConnection(&local_d0,uVar2,'\x14','\x16',uVar3,'-','\x16','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_d0);
  pMVar4 = add_gh_falling_room((RandomizerWorld *)golas_heart_palette,stairs_palette_1);
  this->_room_13 = pMVar4;
  pvVar6 = World::map_connections((World *)golas_heart_palette);
  uVar2 = Map::id(this->_room_12);
  uVar3 = Map::id(this->_room_13);
  MapConnection::MapConnection(&local_dc,uVar2,'\x14','\x16',uVar3,'\"','\x19','\x04','\0');
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (pvVar6,&local_dc);
  pMVar4 = add_gh_final_fight_room((RandomizerWorld *)golas_heart_palette,local_40);
  this->_room_14 = pMVar4;
  pMVar4 = this->_room_13;
  uVar2 = Map::id(this->_room_14);
  Map::fall_destination(pMVar4,uVar2);
  return;
}

Assistant:

void PatchAddGolasHeart::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    MapPalette* golas_heart_palette = build_golas_heart_palette(world);
    MapPalette* stairs_palette_2 = build_greyscale_palette(world, world.map(MAP_LAKE_SHRINE_342)->palette());
    MapPalette* stairs_palette_1 = build_transition_palette(world, golas_heart_palette, stairs_palette_2);
    MapPalette* final_fight_palette = build_greyscale_palette(world, world.map(MAP_NOLE_ARENA)->palette(), 0.4);

    _room_1 = add_gh_room_1(world);

    // Archway
    _room_2 = add_gh_room_2(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_1->id(), 33, 48, _room_2->id(), 25, 34, 2));

    // Double red spinner room
    _room_3 = add_gh_room_3(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 25, 23, _room_3->id(), 25, 34, 2));

    // Lizards room
    _room_4 = add_gh_room_4(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 25, 19, _room_4->id(), 25, 34, 2));

    // Solo unicorn room
    _room_5 = add_gh_room_5(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_4->id(), 34, 25, 4));

    // Mirrors T-room
    _room_6 = add_gh_room_6(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 25, 19, _room_5->id(), 25, 34, 2));
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 19, 25, _room_2->id(), 34, 25, 4));

    // Healing room
    _room_7 = add_gh_room_7(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_7->id(), 19, 25, _room_6->id(), 34, 25, 4));

    // WS orc arena
    _room_8 = add_gh_room_8(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 19, 25, _room_8->id(), 27, 18, 4));

    // WS underground
    _room_9 = add_gh_room_9(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 31, 18, _room_8->id(), 18, 19, 10));

    // Giant stairs
    _room_10 = add_gh_stairs_room(world, golas_heart_palette, MAP_GOLAS_HEART_STAIRS_1);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 16, 51, _room_10->id(), 45, 22, 4));
    _room_11 = add_gh_stairs_room(world, stairs_palette_1, MAP_GOLAS_HEART_STAIRS_2);
    world.map_connections().emplace_back(MapConnection(_room_10->id(), 20, 22, _room_11->id(), 45, 22, 4));
    _room_12 = add_gh_stairs_room(world, stairs_palette_2, MAP_GOLAS_HEART_STAIRS_3);
    world.map_connections().emplace_back(MapConnection(_room_11->id(), 20, 22, _room_12->id(), 45, 22, 4));

    // Falling room
    _room_13 = add_gh_falling_room(world, stairs_palette_2);
    world.map_connections().emplace_back(MapConnection(_room_12->id(), 20, 22, _room_13->id(), 34, 25, 4));

    // Dark Nole room
    _room_14 = add_gh_final_fight_room(world, final_fight_palette);
    _room_13->fall_destination(_room_14->id());
}